

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O0

void __thiscall
slang::syntax::RandCaseStatementSyntax::RandCaseStatementSyntax
          (RandCaseStatementSyntax *this,NamedLabelSyntax *label,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,Token randCase,
          SyntaxList<slang::syntax::RandCaseItemSyntax> *items,Token endCase)

{
  undefined4 uVar1;
  bool bVar2;
  reference ppRVar3;
  SyntaxNode *in_RCX;
  SyntaxNode *in_RDI;
  undefined8 in_R8;
  StatementSyntax *in_R9;
  RandCaseItemSyntax *child;
  iterator __end2;
  iterator __begin2;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *__range2;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *in_stack_ffffffffffffff98;
  SyntaxList<slang::syntax::RandCaseItemSyntax> *this_00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffffb8;
  __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
  in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  
  this_00 = (SyntaxList<slang::syntax::RandCaseItemSyntax> *)&stack0x00000008;
  StatementSyntax::StatementSyntax
            (in_R9,(SyntaxKind)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
             (NamedLabelSyntax *)in_stack_ffffffffffffffc0._M_current,in_stack_ffffffffffffffb8);
  in_RDI[3].previewNode = in_RCX;
  *(undefined8 *)(in_RDI + 4) = in_R8;
  SyntaxList<slang::syntax::RandCaseItemSyntax>::SyntaxList(this_00,in_stack_ffffffffffffff98);
  in_RDI[6].previewNode = (SyntaxNode *)(this_00->super_SyntaxListBase)._vptr_SyntaxListBase;
  uVar1 = *(undefined4 *)&(this_00->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  in_RDI[7].kind = (this_00->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&in_RDI[7].field_0x4 = uVar1;
  *(SyntaxNode **)(in_RDI + 5) = in_RDI;
  std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::begin
            ((span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *)
             in_stack_ffffffffffffff98);
  std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>::end
            ((span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL> *)in_RDI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                      ((__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)this_00,
                       (__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                        *)in_stack_ffffffffffffff98);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    ppRVar3 = __gnu_cxx::
              __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
              ::operator*((__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                           *)&stack0xffffffffffffffc0);
    ((*ppRVar3)->super_SyntaxNode).parent = in_RDI;
    __gnu_cxx::
    __normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
    ::operator++((__normal_iterator<slang::syntax::RandCaseItemSyntax_**,_std::span<slang::syntax::RandCaseItemSyntax_*,_18446744073709551615UL>_>
                  *)&stack0xffffffffffffffc0);
  }
  return;
}

Assistant:

RandCaseStatementSyntax(NamedLabelSyntax* label, const SyntaxList<AttributeInstanceSyntax>& attributes, Token randCase, const SyntaxList<RandCaseItemSyntax>& items, Token endCase) :
        StatementSyntax(SyntaxKind::RandCaseStatement, label, attributes), randCase(randCase), items(items), endCase(endCase) {
        this->items.parent = this;
        for (auto child : this->items)
            child->parent = this;
    }